

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLT.h
# Opt level: O1

Index Eigen::internal::llt_inplace<double,1>::unblocked<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                (Matrix<double,__1,__1,_0,__1,__1> *mat)

{
  double *pdVar1;
  ulong uVar2;
  ulong uVar3;
  double *pdVar4;
  long lVar5;
  char *__function;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ResScalar *pRVar14;
  ulong cols;
  Index size;
  ulong uVar15;
  double dVar16;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar17 [16];
  double __x;
  undefined4 uVar18;
  undefined4 uVar19;
  const_blas_data_mapper<double,_long,_0> local_b0;
  const_blas_data_mapper<double,_long,_1> local_a0;
  ulong local_90;
  undefined1 local_88 [16];
  long local_70;
  double local_68;
  long local_60;
  ulong local_58;
  ulong local_50;
  Matrix<double,__1,__1,_0,__1,__1> *local_48;
  long local_40;
  ResScalar *local_38;
  
  uVar8 = (mat->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  local_48 = mat;
  if (uVar8 != (mat->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_cols) {
    __assert_fail("mat.rows()==mat.cols()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MacWen[P]CMAES/include/../3rdParty/Eigen/src/Cholesky/LLT.h"
                  ,0x136,
                  "static Index Eigen::internal::llt_inplace<double, 1>::unblocked(MatrixType &) [Scalar = double, UpLo = 1, MatrixType = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  lVar12 = 0;
  uVar13 = 0;
  if (0 < (long)uVar8) {
    uVar13 = uVar8;
  }
  pRVar14 = (ResScalar *)0x8;
  lVar10 = -1;
  cols = 0;
  uVar9 = uVar8;
  local_90 = uVar13;
  local_50 = uVar8;
  while( true ) {
    if (cols == uVar13) {
      return -1;
    }
    pdVar1 = (local_48->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_data;
    uVar15 = ~cols + uVar8;
    if ((long)uVar15 < 0 && pdVar1 != (double *)0x0) {
      __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/MacWen[P]CMAES/include/../3rdParty/Eigen/src/Core/MapBase.h"
                    ,0xb0,
                    "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1>, Level = 0]"
                   );
    }
    if ((((long)uVar15 < 0) ||
        (lVar5 = (local_48->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                 m_storage.m_rows, (long)(lVar5 - uVar15) <= (long)cols)) ||
       ((local_48->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
        m_cols <= (long)cols)) break;
    if (lVar5 <= (long)cols) {
      __function = 
      "Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = 1, BlockCols = -1, InnerPanel = false]"
      ;
      goto LAB_0011330c;
    }
    __x = pdVar1[lVar5 * cols + cols];
    if (cols != 0) {
      dVar16 = pdVar1[cols];
      dVar16 = dVar16 * dVar16;
      if (cols != 1) {
        pdVar4 = (double *)(lVar12 + lVar5 * 8 + (long)pdVar1);
        lVar6 = lVar10;
        do {
          dVar16 = dVar16 + *pdVar4 * *pdVar4;
          pdVar4 = pdVar4 + lVar5;
          lVar6 = lVar6 + -1;
        } while (lVar6 != 0);
      }
      __x = __x - dVar16;
    }
    uVar3 = cols;
    local_60 = lVar5;
    if (0.0 < __x) {
      local_88._0_8_ = pdVar1 + cols;
      local_70 = lVar12;
      local_68 = __x;
      local_40 = lVar10;
      if (__x < 0.0) {
        local_38 = pRVar14;
        dVar16 = sqrt(__x);
        uVar18 = (undefined4)extraout_XMM0_Qb;
        uVar19 = (undefined4)((ulong)extraout_XMM0_Qb >> 0x20);
        pRVar14 = local_38;
      }
      else {
        uVar18 = 0;
        uVar19 = 0;
        dVar16 = SQRT(__x);
      }
      local_38 = pdVar1 + cols + 1 + lVar5 * cols;
      lVar12 = (local_48->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
               m_storage.m_rows;
      (local_48->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data
      [lVar12 * cols + cols] = dVar16;
      if (uVar15 != 0 && cols != 0) {
        local_b0.super_blas_data_mapper<const_double,_long,_0,_0>.m_stride = local_60;
        local_a0.super_blas_data_mapper<const_double,_long,_1,_0>.m_data = (double *)local_88._0_8_;
        local_88._8_4_ = uVar18;
        local_88._0_8_ = dVar16;
        local_88._12_4_ = uVar19;
        local_b0.super_blas_data_mapper<const_double,_long,_0,_0>.m_data = pdVar1 + cols + 1;
        local_a0.super_blas_data_mapper<const_double,_long,_1,_0>.m_stride = lVar12;
        general_matrix_vector_product<long,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_0,_false,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_1>,_false,_0>
        ::run(uVar15,cols,&local_b0,&local_a0,local_38,1,-1.0);
        dVar16 = local_88._0_8_;
      }
      uVar3 = local_58;
      uVar8 = local_50;
      lVar10 = local_40;
      lVar12 = local_70;
      uVar13 = local_90;
      __x = local_68;
      if (uVar15 != 0) {
        uVar2 = uVar15;
        if ((((ulong)local_38 & 7) == 0) &&
           (uVar2 = (ulong)((uint)((ulong)local_38 >> 3) & 1), (long)uVar15 <= (long)uVar2)) {
          uVar2 = uVar15;
        }
        if (0 < (long)uVar2) {
          lVar5 = local_60 * local_70 + (long)pRVar14;
          uVar7 = 0;
          do {
            *(double *)((long)pdVar1 + uVar7 * 8 + lVar5) =
                 *(double *)((long)pdVar1 + uVar7 * 8 + lVar5) / dVar16;
            uVar7 = uVar7 + 1;
          } while (uVar2 != uVar7);
        }
        lVar6 = uVar15 - uVar2;
        uVar7 = lVar6 - (lVar6 >> 0x3f) & 0xfffffffffffffffe;
        lVar5 = uVar7 + uVar2;
        if (1 < lVar6) {
          lVar6 = (local_60 + 1) * local_70;
          uVar11 = uVar2;
          do {
            auVar17._8_8_ = dVar16;
            auVar17._0_8_ = dVar16;
            auVar17 = divpd(*(undefined1 (*) [16])((long)pdVar1 + uVar11 * 8 + lVar6 + 8),auVar17);
            *(undefined1 (*) [16])((long)pdVar1 + uVar11 * 8 + lVar6 + 8) = auVar17;
            uVar11 = uVar11 + 2;
          } while ((long)uVar11 < lVar5);
        }
        if (lVar5 < (long)uVar15) {
          uVar15 = uVar2 + uVar7 + 1;
          lVar5 = (local_60 + 1) * local_70;
          do {
            *(double *)((long)pdVar1 + uVar15 * 8 + lVar5) =
                 *(double *)((long)pdVar1 + uVar15 * 8 + lVar5) / dVar16;
            uVar15 = uVar15 + 1;
          } while (uVar9 != uVar15);
        }
      }
    }
    cols = cols + 1;
    lVar10 = lVar10 + 1;
    lVar12 = lVar12 + 8;
    pRVar14 = (ResScalar *)((long)pRVar14 + 8);
    uVar9 = uVar9 - 1;
    local_58 = uVar3;
    if (__x <= 0.0) {
      return uVar3;
    }
  }
  __function = 
  "Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
  ;
LAB_0011330c:
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/MacWen[P]CMAES/include/../3rdParty/Eigen/src/Core/Block.h"
                ,0x93,__function);
}

Assistant:

static Index unblocked(MatrixType& mat)
  {
    using std::sqrt;

    eigen_assert(mat.rows()==mat.cols());
    const Index size = mat.rows();
    for(Index k = 0; k < size; ++k)
    {
      Index rs = size-k-1; // remaining size

      Block<MatrixType,Dynamic,1> A21(mat,k+1,k,rs,1);
      Block<MatrixType,1,Dynamic> A10(mat,k,0,1,k);
      Block<MatrixType,Dynamic,Dynamic> A20(mat,k+1,0,rs,k);

      RealScalar x = numext::real(mat.coeff(k,k));
      if (k>0) x -= A10.squaredNorm();
      if (x<=RealScalar(0))
        return k;
      mat.coeffRef(k,k) = x = sqrt(x);
      if (k>0 && rs>0) A21.noalias() -= A20 * A10.adjoint();
      if (rs>0) A21 /= x;
    }
    return -1;
  }